

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_x86.c
# Opt level: O1

int funchook_fix_code(funchook_t *funchook,funchook_entry_t *entry,ip_displacement_t *disp)

{
  long lVar1;
  uint8_t *puVar2;
  void *pvVar3;
  insn_t *piVar4;
  int iVar5;
  long lVar6;
  
  pvVar3 = entry->target_func;
  lVar1 = (long)pvVar3 + 5;
  lVar6 = (long)entry->hook_func - lVar1;
  iVar5 = (int)lVar6;
  if (iVar5 == lVar6) {
    entry->new_code[0] = 0xe9;
    *(int *)(entry->new_code + 1) = iVar5;
    funchook_log(funchook,"  Write jump32 0x%016lx -> 0x%016lx\n");
    entry->transit[0] = '\0';
  }
  else {
    puVar2 = entry->transit;
    entry->new_code[0] = 0xe9;
    *(int *)(entry->new_code + 1) = (int)puVar2 - (int)lVar1;
    funchook_log(funchook,"  Write jump32 0x%016lx -> 0x%016lx\n",pvVar3,puVar2);
    pvVar3 = entry->hook_func;
    entry->transit[0] = 0xff;
    entry->transit[1] = '%';
    entry->transit[2] = '\0';
    entry->transit[3] = '\0';
    entry->transit[4] = '\0';
    entry->transit[5] = '\0';
    *(void **)(entry->transit + 6) = pvVar3;
    funchook_log(funchook,"  Write jump64 0x%016lx -> 0x%016lx\n",puVar2);
  }
  iVar5 = (int)entry->trampoline;
  *(int *)(entry->trampoline + disp->disp[0].pos_offset) =
       *(int *)&disp->disp[0].dst_addr - ((int)disp->disp[0].src_addr_offset + iVar5);
  piVar4 = disp->disp[1].dst_addr;
  if (piVar4 != (insn_t *)0x0) {
    *(int *)(entry->trampoline + disp->disp[1].pos_offset) =
         (int)piVar4 - ((int)disp->disp[1].src_addr_offset + iVar5);
  }
  return 0;
}

Assistant:

int funchook_fix_code(funchook_t *funchook, funchook_entry_t *entry, const ip_displacement_t *disp)
{
    insn_t *src_addr;
    uint32_t *offset_addr;

#ifdef CPU_X86_64
    if (funchook_jump32_avail(entry->target_func, entry->hook_func)) {
        funchook_write_jump32(funchook, entry->target_func, entry->hook_func, entry->new_code);
        entry->transit[0] = 0;
    } else {
        funchook_write_jump32(funchook, entry->target_func, entry->transit, entry->new_code);
        funchook_write_jump64(funchook, entry->transit, entry->hook_func);
    }
#else
    funchook_write_jump32(funchook, entry->target_func, entry->hook_func, entry->new_code);
#endif
    /* fix rip-relative offsets */
    src_addr = entry->trampoline + disp->disp[0].src_addr_offset;
    offset_addr = (uint32_t*)(entry->trampoline + disp->disp[0].pos_offset);
    *offset_addr = (uint32_t)(disp->disp[0].dst_addr - src_addr);
    if (disp->disp[1].dst_addr != 0) {
        src_addr = entry->trampoline + disp->disp[1].src_addr_offset;
        offset_addr = (uint32_t*)(entry->trampoline + disp->disp[1].pos_offset);
        *offset_addr = (uint32_t)(disp->disp[1].dst_addr - src_addr);
    }
    return 0;
}